

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::PopulateCustomVectors(cmCTestTestHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  allocator local_39;
  string local_38;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&local_38,"CTEST_CUSTOM_PRE_TEST",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPreTest);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&local_38,"CTEST_CUSTOM_POST_TEST",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPostTest);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&local_38,"CTEST_CUSTOM_TESTS_IGNORE",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string
            ((string *)&local_38,"CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",&local_39);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&this->CustomMaximumPassedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string
            ((string *)&local_38,"CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",&local_39);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&this->CustomMaximumFailedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCTestTestHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_TEST",
                                    this->CustomPreTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_TEST",
                                    this->CustomPostTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_TESTS_IGNORE",
                                    this->CustomTestsIgnore);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
    this->CustomMaximumPassedTestOutputSize);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
    this->CustomMaximumFailedTestOutputSize);
}